

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEnginePrivate::nativeSetMulticastInterface
          (QNativeSocketEnginePrivate *this,QNetworkInterface *iface)

{
  NetworkLayerProtocol NVar1;
  quint32 qVar2;
  int iVar3;
  char *pcVar4;
  QArrayDataPointer<QNetworkAddressEntry> *__optval;
  int in_EDX;
  int __optname;
  int __level;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  bool bVar6;
  uint v_1;
  in_addr v;
  QNetworkAddressEntry local_60;
  QArrayDataPointer<QNetworkAddressEntry> local_58;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)((this->super_QAbstractSocketEnginePrivate).socketProtocol + UnknownNetworkLayerProtocol
            ) < 2) {
    pcVar4 = QNetworkInterface::index((QNetworkInterface *)iface,(char *)iface,in_EDX);
    __optval = &local_58;
    local_58.d = (Data *)CONCAT44(local_58.d._4_4_,(int)pcVar4);
    iVar3 = (int)this->socketDescriptor;
    __level = 0x29;
    __optname = 0x11;
  }
  else {
    local_34 = 0xaaaaaaaa;
    bVar6 = QNetworkInterface::isValid((QNetworkInterface *)iface);
    if (bVar6) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkInterface::addressEntries
                ((QList<QNetworkAddressEntry> *)&local_58,(QNetworkInterface *)iface);
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        puVar5 = (undefined1 *)0x0;
        do {
          QNetworkAddressEntry::ip(&local_60);
          NVar1 = QHostAddress::protocol((QHostAddress *)&local_60);
          if (NVar1 == IPv4Protocol) {
            qVar2 = QHostAddress::toIPv4Address((QHostAddress *)&local_60,(bool *)0x0);
            local_34 = qVar2 >> 0x18 | (qVar2 & 0xff0000) >> 8 | (qVar2 & 0xff00) << 8 |
                       qVar2 << 0x18;
            iVar3 = setsockopt((int)this->socketDescriptor,0,0x20,&local_34,4);
            if (iVar3 != -1) {
              QHostAddress::~QHostAddress((QHostAddress *)&local_60);
              bVar6 = true;
              goto LAB_0022fbb6;
            }
          }
          QHostAddress::~QHostAddress((QHostAddress *)&local_60);
          puVar5 = puVar5 + 1;
        } while (puVar5 < (ulong)local_58.size);
      }
      bVar6 = false;
LAB_0022fbb6:
      QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_58);
      goto LAB_0022fbeb;
    }
    __optval = (QArrayDataPointer<QNetworkAddressEntry> *)&local_34;
    local_34 = 0;
    iVar3 = (int)this->socketDescriptor;
    __level = 0;
    __optname = 0x20;
  }
  iVar3 = setsockopt(iVar3,__level,__optname,__optval,4);
  bVar6 = iVar3 != -1;
LAB_0022fbeb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::nativeSetMulticastInterface(const QNetworkInterface &iface)
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v = iface.index();
        return (::setsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, sizeof(v)) != -1);
    }

    struct in_addr v;
    if (iface.isValid()) {
        QList<QNetworkAddressEntry> entries = iface.addressEntries();
        for (int i = 0; i < entries.size(); ++i) {
            const QNetworkAddressEntry &entry = entries.at(i);
            const QHostAddress &ip = entry.ip();
            if (ip.protocol() == QAbstractSocket::IPv4Protocol) {
                v.s_addr = htonl(ip.toIPv4Address());
                int r = ::setsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, sizeof(v));
                if (r != -1)
                    return true;
            }
        }
        return false;
    }

    v.s_addr = INADDR_ANY;
    return (::setsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, sizeof(v)) != -1);
}